

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem2der.c
# Opt level: O2

int convert_pem_to_der(uchar *input,size_t ilen,uchar *output,size_t *olen)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  uchar *puVar10;
  size_t len;
  ulong *local_38;
  
  len = 0;
  pcVar3 = strstr((char *)input,"-----BEGIN");
  iVar2 = -1;
  if (pcVar3 != (char *)0x0) {
    puVar4 = (uchar *)strstr((char *)input,"-----END");
    if (puVar4 != (uchar *)0x0) {
      puVar10 = input + ilen;
      pcVar8 = pcVar3 + (9 - (long)puVar4);
      for (puVar5 = (uchar *)(pcVar3 + 10); (puVar5 < puVar10 && (*puVar5 != '-'));
          puVar5 = puVar5 + 1) {
        pcVar8 = pcVar8 + 1;
      }
      do {
        puVar6 = puVar5;
        pcVar8 = pcVar8 + 1;
        if (puVar10 <= puVar6) break;
        puVar5 = puVar6 + 1;
      } while (*puVar6 == '-');
      uVar7 = (ulong)(*puVar6 == '\r');
      lVar9 = (puVar6[uVar7] == '\n') + uVar7;
      puVar5 = puVar6 + 1 + lVar9 + -1;
      if (puVar4 <= puVar10 && puVar5 < puVar4) {
        local_38 = olen;
        iVar1 = mbedtls_base64_decode((uchar *)0x0,0,&len,puVar5,-(long)(pcVar8 + lVar9));
        if (iVar1 == -0x2c) {
          iVar2 = -0x2c;
        }
        else if (len <= *local_38) {
          iVar2 = mbedtls_base64_decode(output,len,&len,puVar5,-(long)(pcVar8 + lVar9));
          if (iVar2 == 0) {
            *local_38 = len;
            iVar2 = 0;
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int convert_pem_to_der( const unsigned char *input, size_t ilen,
                        unsigned char *output, size_t *olen )
{
    int ret;
    const unsigned char *s1, *s2, *end = input + ilen;
    size_t len = 0;

    s1 = (unsigned char *) strstr( (const char *) input, "-----BEGIN" );
    if( s1 == NULL )
        return( -1 );

    s2 = (unsigned char *) strstr( (const char *) input, "-----END" );
    if( s2 == NULL )
        return( -1 );

    s1 += 10;
    while( s1 < end && *s1 != '-' )
        s1++;
    while( s1 < end && *s1 == '-' )
        s1++;
    if( *s1 == '\r' ) s1++;
    if( *s1 == '\n' ) s1++;

    if( s2 <= s1 || s2 > end )
        return( -1 );

    ret = mbedtls_base64_decode( NULL, 0, &len, (const unsigned char *) s1, s2 - s1 );
    if( ret == MBEDTLS_ERR_BASE64_INVALID_CHARACTER )
        return( ret );

    if( len > *olen )
        return( -1 );

    if( ( ret = mbedtls_base64_decode( output, len, &len, (const unsigned char *) s1,
                               s2 - s1 ) ) != 0 )
    {
        return( ret );
    }

    *olen = len;

    return( 0 );
}